

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::HasWalletSpend(CWallet *this,CTransactionRef *tx)

{
  long lVar1;
  bool bVar2;
  CWallet *this_00;
  Txid *hashIn;
  Txid *pTVar3;
  COutPoint *in_RDI;
  long in_FS_OFFSET;
  uint i;
  Txid *txid;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  undefined1 local_2d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (AnnotatedMixin<std::recursive_mutex> *)0xad72c9);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = (CWallet *)
            CTransaction::GetHash
                      ((CTransaction *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                      );
  uVar4 = 0;
  do {
    hashIn = (Txid *)(ulong)uVar4;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    pTVar3 = (Txid *)std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                               ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (pTVar3 <= hashIn) {
      local_2d = false;
LAB_00ad7357:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_2d;
      }
      __stack_chk_fail();
    }
    COutPoint::COutPoint(in_RDI,hashIn,in_stack_ffffffffffffff9c);
    bVar2 = IsSpent(this_00,(COutPoint *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
    if (bVar2) {
      local_2d = true;
      goto LAB_00ad7357;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool CWallet::HasWalletSpend(const CTransactionRef& tx) const
{
    AssertLockHeld(cs_wallet);
    const Txid& txid = tx->GetHash();
    for (unsigned int i = 0; i < tx->vout.size(); ++i) {
        if (IsSpent(COutPoint(txid, i))) {
            return true;
        }
    }
    return false;
}